

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int jsonEachNext(sqlite3_vtab_cursor *cur)

{
  char cVar1;
  uint uVar2;
  sqlite3_vtab *psVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
    if (*(char *)&cur[3].pVtab == '\a') {
      uVar4 = *(uint *)&cur[2].pVtab;
      iVar5 = 2;
      if (5 < *(byte *)(&(cur[7].pVtab)->pModule + (ulong)(uVar4 + 1) * 2)) {
        iVar5 = *(int *)((long)&(cur[7].pVtab)->pModule + (ulong)(uVar4 + 1) * 0x10 + 4) + 2;
      }
    }
    else {
      if (*(char *)&cur[3].pVtab != '\x06') {
        *(undefined4 *)&cur[2].pVtab = *(undefined4 *)((long)&cur[2].pVtab + 4);
        return 0;
      }
      uVar4 = *(uint *)&cur[2].pVtab;
      iVar5 = 1;
      if (5 < *(byte *)(&(cur[7].pVtab)->pModule + (ulong)uVar4 * 2)) {
        iVar5 = *(int *)((long)&(cur[7].pVtab)->pModule + (ulong)uVar4 * 0x10 + 4) + 1;
      }
    }
    *(uint *)&cur[2].pVtab = iVar5 + uVar4;
    *(int *)&cur[1].pVtab = *(int *)&cur[1].pVtab + 1;
  }
  else {
    psVar3 = cur[7].pVtab;
    if ((*(byte *)((long)&psVar3->pModule + (ulong)*(uint *)&cur[2].pVtab * 0x10 + 1) & 0x40) != 0)
    {
      *(uint *)&cur[2].pVtab = *(uint *)&cur[2].pVtab + 1;
    }
    uVar2 = *(uint *)&cur[2].pVtab;
    uVar4 = uVar2 + 1;
    *(uint *)&cur[2].pVtab = uVar4;
    *(int *)&cur[1].pVtab = *(int *)&cur[1].pVtab + 1;
    if (uVar4 < *(uint *)((long)&cur[2].pVtab + 4)) {
      uVar4 = *(uint *)((long)&(cur[9].pVtab)->pModule + (ulong)uVar4 * 4);
      uVar6 = (ulong)uVar4;
      cVar1 = *(char *)(&psVar3->pModule + uVar6 * 2);
      *(char *)&cur[3].pVtab = cVar1;
      if (cVar1 == '\x06') {
        if (uVar4 == uVar2) {
          (&psVar3->nRef)[uVar6 * 4] = 0;
        }
        else {
          (&psVar3->nRef)[uVar6 * 4] = (&psVar3->nRef)[uVar6 * 4] + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jsonEachNext(sqlite3_vtab_cursor *cur){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  if( p->bRecursive ){
    if( p->sParse.aNode[p->i].jnFlags & JNODE_LABEL ) p->i++;
    p->i++;
    p->iRowid++;
    if( p->i<p->iEnd ){
      u32 iUp = p->sParse.aUp[p->i];
      JsonNode *pUp = &p->sParse.aNode[iUp];
      p->eType = pUp->eType;
      if( pUp->eType==JSON_ARRAY ){
        assert( pUp->eU==0 || pUp->eU==3 );
        testcase( pUp->eU==3 );
        VVA( pUp->eU = 3 );
        if( iUp==p->i-1 ){
          pUp->u.iKey = 0;
        }else{
          pUp->u.iKey++;
        }
      }
    }
  }else{
    switch( p->eType ){
      case JSON_ARRAY: {
        p->i += jsonNodeSize(&p->sParse.aNode[p->i]);
        p->iRowid++;
        break;
      }
      case JSON_OBJECT: {
        p->i += 1 + jsonNodeSize(&p->sParse.aNode[p->i+1]);
        p->iRowid++;
        break;
      }
      default: {
        p->i = p->iEnd;
        break;
      }
    }
  }
  return SQLITE_OK;
}